

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus decodeBDXAddr20Operand(MCInst *Inst,uint64_t Field,uint *Regs)

{
  ulong uVar1;
  int64_t Val;
  uint local_5c;
  uint local_44;
  uint64_t Disp;
  uint64_t Base;
  uint64_t Index;
  uint *Regs_local;
  uint64_t Field_local;
  MCInst *Inst_local;
  
  uVar1 = Field >> 0x14 & 0xf;
  if (uVar1 == 0) {
    local_44 = 0;
  }
  else {
    local_44 = Regs[uVar1];
  }
  MCOperand_CreateReg0(Inst,local_44);
  Val = SignExtend64((Field & 0xfff00) >> 8 | (Field & 0xff) << 0xc,0x14);
  MCOperand_CreateImm0(Inst,Val);
  if (Field >> 0x18 == 0) {
    local_5c = 0;
  }
  else {
    local_5c = Regs[Field >> 0x18];
  }
  MCOperand_CreateReg0(Inst,local_5c);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeBDXAddr20Operand(MCInst *Inst, uint64_t Field,
		const unsigned *Regs)
{
	uint64_t Index = Field >> 24;
	uint64_t Base = (Field >> 20) & 0xf;
	uint64_t Disp = ((Field & 0xfff00) >> 8) | ((Field & 0xff) << 12);

	//assert(Index < 16 && "Invalid BDXAddr20");
	MCOperand_CreateReg0(Inst, Base == 0 ? 0 : Regs[Base]);
	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 20));
	MCOperand_CreateReg0(Inst, Index == 0 ? 0 : Regs[Index]);

	return MCDisassembler_Success;
}